

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitStream.h
# Opt level: O2

uint __thiscall BitStreamReader::getBits(BitStreamReader *this,uint num)

{
  uint uVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint *buff;
  
  if ((num < 0x21) && (uVar4 = (this->super_BitStream).m_totalBits, num <= uVar4)) {
    uVar3 = this->m_bitLeft;
    if (uVar3 < num) {
      if ((ulong)uVar3 == 0) {
        iVar5 = 0;
      }
      else {
        iVar5 = (BitStream::m_masks[uVar3] & this->m_curVal) << ((char)num - (char)uVar3 & 0x1fU);
      }
      buff = (this->super_BitStream).m_buffer + 1;
      (this->super_BitStream).m_buffer = buff;
      uVar1 = getCurVal(this,buff);
      this->m_curVal = uVar1;
      uVar4 = (this->super_BitStream).m_totalBits;
      uVar3 = (this->m_bitLeft - num) + 0x20;
    }
    else {
      uVar3 = uVar3 - num;
      uVar1 = this->m_curVal;
      iVar5 = 0;
    }
    this->m_bitLeft = uVar3;
    (this->super_BitStream).m_totalBits = uVar4 - num;
    return (uVar1 >> ((byte)uVar3 & 0x1f)) + iVar5 & BitStream::m_masks[num];
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__exception_00249978;
  __cxa_throw(puVar2,&BitStreamException::typeinfo,std::exception::~exception);
}

Assistant:

[[nodiscard]] unsigned getBits(const unsigned num)
    {
        if (num > INT_BIT || m_totalBits < num)
            THROW_BITSTREAM_ERR;
        unsigned prevVal = 0;
        if (num <= m_bitLeft)
            m_bitLeft -= num;
        else
        {
            if (m_bitLeft != 0)
                prevVal = (m_curVal & m_masks[m_bitLeft]) << (num - m_bitLeft);
            m_buffer++;
            m_curVal = getCurVal(m_buffer);
            m_bitLeft += INT_BIT - num;
        }
        m_totalBits -= num;
        return prevVal + (m_curVal >> m_bitLeft) & m_masks[num];
    }